

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_sign_deterministic
              (uint8_t *private_key,uint8_t *message_hash,uint hash_size,
              uECC_HashContext *hash_context,uint8_t *signature,uECC_Curve curve)

{
  char cVar1;
  short sVar2;
  uint8_t *K_00;
  char cVar3;
  int iVar4;
  uint8_t *message;
  uECC_word_t mask;
  wordcount_t T_bytes;
  uint8_t *T_ptr;
  uECC_word_t T [4];
  ulong uStack_60;
  uint i;
  uECC_word_t tries;
  bitcount_t num_n_bits;
  wordcount_t num_n_words;
  wordcount_t num_bytes;
  uint8_t *V;
  uint8_t *K;
  uECC_Curve curve_local;
  uint8_t *signature_local;
  uECC_HashContext *hash_context_local;
  uint hash_size_local;
  uint8_t *message_hash_local;
  uint8_t *private_key_local;
  
  K_00 = hash_context->tmp;
  message = K_00 + hash_context->result_size;
  cVar1 = curve->num_bytes;
  cVar3 = (char)((curve->num_n_bits + 0x3f) / 0x40);
  sVar2 = curve->num_n_bits;
  for (T[3]._4_4_ = 0; T[3]._4_4_ < hash_context->result_size; T[3]._4_4_ = T[3]._4_4_ + 1) {
    message[T[3]._4_4_] = '\x01';
    K_00[T[3]._4_4_] = '\0';
  }
  HMAC_init(hash_context,K_00);
  message[hash_context->result_size] = '\0';
  HMAC_update(hash_context,message,hash_context->result_size + 1);
  HMAC_update(hash_context,private_key,(int)cVar1);
  HMAC_update(hash_context,message_hash,hash_size);
  HMAC_finish(hash_context,K_00,K_00);
  update_V(hash_context,K_00,message);
  HMAC_init(hash_context,K_00);
  message[hash_context->result_size] = '\x01';
  HMAC_update(hash_context,message,hash_context->result_size + 1);
  HMAC_update(hash_context,private_key,(int)cVar1);
  HMAC_update(hash_context,message_hash,hash_size);
  HMAC_finish(hash_context,K_00,K_00);
  update_V(hash_context,K_00,message);
  uStack_60 = 0;
LAB_0011d0d4:
  if (0x3f < uStack_60) {
    return 0;
  }
  mask._7_1_ = '\0';
  do {
    update_V(hash_context,K_00,message);
    for (T[3]._4_4_ = 0; T[3]._4_4_ < hash_context->result_size; T[3]._4_4_ = T[3]._4_4_ + 1) {
      *(uint8_t *)((long)T + (long)mask._7_1_ + -8) = message[T[3]._4_4_];
      if (cVar3 * 8 <= (int)(char)(mask._7_1_ + '\x01')) {
        if ((int)sVar2 < (short)cVar3 * 0x40) {
          T[(long)(cVar3 + -1) + -1] =
               0xffffffffffffffffU >> (-(char)sVar2 & 0x3fU) & T[(long)(cVar3 + -1) + -1];
        }
        iVar4 = uECC_sign_with_k(private_key,message_hash,hash_size,(uECC_word_t *)&T_ptr,signature,
                                 curve);
        if (iVar4 != 0) {
          return 1;
        }
        HMAC_init(hash_context,K_00);
        message[hash_context->result_size] = '\0';
        HMAC_update(hash_context,message,hash_context->result_size + 1);
        HMAC_finish(hash_context,K_00,K_00);
        update_V(hash_context,K_00,message);
        uStack_60 = uStack_60 + 1;
        goto LAB_0011d0d4;
      }
      mask._7_1_ = mask._7_1_ + '\x01';
    }
  } while( true );
}

Assistant:

int uECC_sign_deterministic(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            const uECC_HashContext *hash_context,
                            uint8_t *signature,
                            uECC_Curve curve) {
    uint8_t *K = hash_context->tmp;
    uint8_t *V = K + hash_context->result_size;
    wordcount_t num_bytes = curve->num_bytes;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;
    uECC_word_t tries;
    unsigned i;
    for (i = 0; i < hash_context->result_size; ++i) {
        V[i] = 0x01;
        K[i] = 0;
    }

    /* K = HMAC_K(V || 0x00 || int2octets(x) || h(m)) */
    HMAC_init(hash_context, K);
    V[hash_context->result_size] = 0x00;
    HMAC_update(hash_context, V, hash_context->result_size + 1);
    HMAC_update(hash_context, private_key, num_bytes);
    HMAC_update(hash_context, message_hash, hash_size);
    HMAC_finish(hash_context, K, K);

    update_V(hash_context, K, V);

    /* K = HMAC_K(V || 0x01 || int2octets(x) || h(m)) */
    HMAC_init(hash_context, K);
    V[hash_context->result_size] = 0x01;
    HMAC_update(hash_context, V, hash_context->result_size + 1);
    HMAC_update(hash_context, private_key, num_bytes);
    HMAC_update(hash_context, message_hash, hash_size);
    HMAC_finish(hash_context, K, K);

    update_V(hash_context, K, V);

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        uECC_word_t T[uECC_MAX_WORDS];
        uint8_t *T_ptr = (uint8_t *)T;
        wordcount_t T_bytes = 0;
        for (;;) {
            update_V(hash_context, K, V);
            for (i = 0; i < hash_context->result_size; ++i) {
                T_ptr[T_bytes++] = V[i];
                if (T_bytes >= num_n_words * uECC_WORD_SIZE) {
                    goto filled;
                }
            }
        }
    filled:
        if ((bitcount_t)num_n_words * uECC_WORD_SIZE * 8 > num_n_bits) {
            uECC_word_t mask = (uECC_word_t)-1;
            T[num_n_words - 1] &=
                mask >> ((bitcount_t)(num_n_words * uECC_WORD_SIZE * 8 - num_n_bits));
        }

        if (uECC_sign_with_k(private_key, message_hash, hash_size, T, signature, curve)) {
            return 1;
        }

        /* K = HMAC_K(V || 0x00) */
        HMAC_init(hash_context, K);
        V[hash_context->result_size] = 0x00;
        HMAC_update(hash_context, V, hash_context->result_size + 1);
        HMAC_finish(hash_context, K, K);

        update_V(hash_context, K, V);
    }
    return 0;
}